

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

bool __thiscall
ddd::DaTrie<true,_true,_false>::search_key(DaTrie<true,_true,_false> *this,Query *query)

{
  pointer pBVar1;
  bool bVar2;
  ulong in_RAX;
  uint uVar3;
  char *rhs;
  uint32_t len;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while( true ) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = SUB84(pBVar1[query->node_pos_],0);
    if ((int)uVar3 < 0) {
      if (query->is_finished_ == true) {
        query->value_ = uVar3 & 0x7fffffff;
        bVar2 = true;
      }
      else {
        uStack_28 = uStack_28 & 0xffffffff;
        rhs = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + (uVar3 & 0x7fffffff);
        bVar2 = utils::match(query->key_ + query->pos_,rhs,(uint32_t *)((long)&uStack_28 + 4));
        if (bVar2) {
          query->value_ = *(uint32_t *)(rhs + (uStack_28 >> 0x20));
        }
      }
      return bVar2;
    }
    uVar3 = (byte)query->key_[query->pos_] ^ uVar3;
    if ((*(uint *)&pBVar1[uVar3].field_0x4 & 0x7fffffff) != query->node_pos_) break;
    query->node_pos_ = uVar3;
    Query::next(query);
  }
  return false;
}

Assistant:

bool search_key(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto child_pos = bc_[query.node_pos()].base() ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    auto value = bc_[query.node_pos()].value();
    if (query.is_finished()) {
      query.set_value(value);
      return true;
    }

    uint32_t len = 0;
    auto tail = tail_.data() + value;
    if (!utils::match(query.key(), tail, len)) {
      return false;
    }
    query.set_value(utils::extract_value(tail + len));
    return true;
  }